

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

double duckdb::DecimalAddOverflowCheck::Operation<double,double,double>(double left,double right)

{
  OutOfRangeException *this;
  bool bVar1;
  allocator local_51;
  double local_50;
  double local_48;
  double result;
  string local_38;
  
  local_50 = left;
  local_48 = right;
  bVar1 = TryDecimalAdd::Operation<double,double,double>(left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_51);
  OutOfRangeException::OutOfRangeException<double,double>(this,&local_38,local_50,local_48);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalAdd::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}